

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

int __thiscall Imf_3_3::Context::version(Context *this)

{
  exr_result_t eVar1;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  uint32_t ver;
  stringstream *in_stack_fffffffffffffe48;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe50;
  exr_const_context_t in_stack_fffffffffffffe58;
  stringstream local_198 [16];
  ostream local_188 [380];
  int local_c;
  
  local_c = 0;
  std::__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe50);
  eVar1 = exr_get_file_version_and_flags
                    (in_stack_fffffffffffffe58,(uint32_t *)in_stack_fffffffffffffe50);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,"Unable to get file version from context");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_fffffffffffffe48);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return local_c;
}

Assistant:

int
Context::version () const
{
    uint32_t ver = 0;

    if (EXR_ERR_SUCCESS != exr_get_file_version_and_flags (*_ctxt, &ver))
    {
        THROW (
            IEX_NAMESPACE::ArgExc, "Unable to get file version from context");
    }

    return static_cast<int> (ver);
}